

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t base64_decode(char *in,size_t inlen,uchar *out)

{
  byte bVar1;
  size_t sVar2;
  uchar uVar3;
  ulong uVar4;
  int iVar5;
  size_t i;
  size_t sVar6;
  
  sVar2 = 0;
  iVar5 = 0;
  sVar6 = 0;
  do {
    if (inlen == sVar6) {
      return sVar2;
    }
    uVar4 = (ulong)(byte)in[sVar6];
    if (uVar4 < 0x3e) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0x3d) {
          return sVar2;
        }
        goto LAB_0010767c;
      }
      iVar5 = iVar5 + 1;
      goto LAB_00107671;
    }
LAB_0010767c:
    bVar1 = base64de[uVar4];
    if (bVar1 == 0xff) {
      return 0;
    }
    switch((int)sVar6 - iVar5 & 3) {
    case 0:
      out[sVar2] = bVar1 << 2;
      break;
    case 1:
      out[sVar2] = out[sVar2] | bVar1 >> 4 & 3;
      uVar3 = bVar1 << 4;
      goto LAB_001076cc;
    case 2:
      out[sVar2] = out[sVar2] | bVar1 >> 2 & 0xf;
      uVar3 = bVar1 << 6;
LAB_001076cc:
      out[sVar2 + 1] = uVar3;
      sVar2 = sVar2 + 1;
      break;
    case 3:
      out[sVar2] = out[sVar2] | bVar1;
      sVar2 = sVar2 + 1;
    }
LAB_00107671:
    sVar6 = sVar6 + 1;
  } while( true );
}

Assistant:

size_t base64_decode(const char* in, size_t inlen, unsigned char* out)
{
	size_t j = 0;
	size_t ignored = 0;

	for (size_t i = 0; i < inlen; i++)
	{
		if (in[i] == BASE64_PAD)
			break;

		if (in[i] == '\n' || in[i] == '\r' || in[i] == '\t' || in[i] == ' ')
		{
			ignored++;
			continue;
		}

		unsigned char c = base64de[(unsigned char)in[i]];

		if (c == 255)
			return 0;

		switch((i - ignored) & 0x3)
		{
			case 0:
				out[j] = (c << 2) & 0xFF;
				break;
			case 1:
				out[j++] |= (c >> 4) & 0x3;
				out[j] = (c & 0xF) << 4; 
				break;
			case 2:
				out[j++] |= (c >> 2) & 0xF;
				out[j] = (c & 0x3) << 6;
				break;
			case 3:
				out[j++] |= c;
				break;
		}
	}

	return j;
}